

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerArrayMethods(Builtins *this)

{
  SymbolKind SVar1;
  pointer p_Var2;
  long lVar3;
  Operator op;
  Operator op_00;
  Operator op_01;
  Operator op_02;
  Operator op_03;
  __allocator_type __a2;
  undefined3 uStack_2db;
  undefined1 local_2d8 [32];
  Type *local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2b0 [2];
  undefined1 local_299;
  Type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_290 [2];
  VoidType *local_280;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  
  local_298 = (Type *)0xe0000000d;
  a_Stack_290[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1100000010;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x10) break;
    local_280 = (VoidType *)lVar3;
    SVar1 = *(SymbolKind *)((long)&a_Stack_290[-1]._M_pi + lVar3);
    p_Var2 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005ae178;
    op.callable = (intptr_t)(local_2d8 + 0x1c);
    op.callback = function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
                  callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__0>;
    local_2d8._0_8_ = &__a2;
    local_2d8._8_8_ = p_Var2;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)&p_Var2->_M_impl,Or,op);
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = (Type *)&p_Var2->_M_impl;
    a_Stack_2b0[0]._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_2d8);
    local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2b8;
    local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2b0[0]._M_pi;
    local_2b8 = (Type *)0x0;
    a_Stack_2b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2b0);
    p_Var2 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005ae178;
    op_00.callable = (intptr_t)(local_2d8 + 0x1c);
    op_00.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__1>;
    local_2d8._0_8_ = &__a2;
    local_2d8._8_8_ = p_Var2;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)&p_Var2->_M_impl,And,op_00);
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = (Type *)&p_Var2->_M_impl;
    a_Stack_2b0[0]._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_2d8);
    local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2b8;
    local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2b0[0]._M_pi;
    local_2b8 = (Type *)0x0;
    a_Stack_2b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_148.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2b0);
    p_Var2 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005ae178;
    op_01.callable = (intptr_t)(local_2d8 + 0x1c);
    op_01.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__2>;
    local_2d8._0_8_ = &__a2;
    local_2d8._8_8_ = p_Var2;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)&p_Var2->_M_impl,XOr,op_01);
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = (Type *)&p_Var2->_M_impl;
    a_Stack_2b0[0]._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_2d8);
    local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2b8;
    local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2b0[0]._M_pi;
    local_2b8 = (Type *)0x0;
    a_Stack_2b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2b0);
    p_Var2 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005ae178;
    op_02.callable = (intptr_t)(local_2d8 + 0x1c);
    op_02.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__3>;
    local_2d8._0_8_ = &__a2;
    local_2d8._8_8_ = p_Var2;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)&p_Var2->_M_impl,Sum,op_02);
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = (Type *)&p_Var2->_M_impl;
    a_Stack_2b0[0]._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_2d8);
    local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2b8;
    local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2b0[0]._M_pi;
    local_2b8 = (Type *)0x0;
    a_Stack_2b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_168);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_168.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2b0);
    p_Var2 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate((allocator_type *)&__a2,1);
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_005ae178;
    op_03.callable = (intptr_t)(local_2d8 + 0x1c);
    op_03.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__4>;
    local_2d8._0_8_ = (element_type *)&__a2;
    local_2d8._8_8_ = p_Var2;
    ArrayReductionMethod::ArrayReductionMethod
              ((ArrayReductionMethod *)&p_Var2->_M_impl,Product,op_03);
    local_2d8._8_8_ = (pointer)0x0;
    local_2b8 = (Type *)&p_Var2->_M_impl;
    a_Stack_2b0[0]._M_pi = &p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_2d8);
    local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2b8;
    local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2b0[0]._M_pi;
    local_2b8 = (Type *)0x0;
    a_Stack_2b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_178);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_178.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_2b0);
    local_2b8._0_4_ = 0xf3;
    ___a2 = 0;
    local_2d8._28_4_ = local_2d8._28_4_ & 0xffffff00;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_188.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf4;
    ___a2 = 0;
    local_2d8[0x1c] = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (Symbol *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_198.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf5;
    ___a2 = 1;
    local_2d8[0x1c] = 0;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (SourceLocation)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1a8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf6;
    ___a2 = 1;
    local_2d8[0x1c] = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1b8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf7;
    ___a2 = 2;
    local_2d8[0x1c] = 0;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1c8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf8;
    ___a2 = 2;
    local_2d8[0x1c] = 1;
    std::
    make_shared<slang::ast::builtins::ArrayLocatorMethod,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              ((KnownSystemName *)local_2d8,(Mode *)&local_2b8,(bool *)&__a2);
    local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (Type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1d8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xf9;
    __a2 = (__allocator_type)0x1;
    std::make_shared<slang::ast::builtins::ArrayMinMaxMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_2b8);
    local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1e8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xfa;
    __a2 = (__allocator_type)0x0;
    std::make_shared<slang::ast::builtins::ArrayMinMaxMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_2b8);
    local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1f8.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8._0_4_ = 0xfb;
    __a2 = (__allocator_type)0x0;
    std::make_shared<slang::ast::builtins::ArrayUniqueMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_2b8);
    local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_208.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_2b8 = (Type *)CONCAT44(local_2b8._4_4_,0xfc);
    ___a2 = CONCAT31(uStack_2db,1);
    std::make_shared<slang::ast::builtins::ArrayUniqueMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_2b8);
    local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (element_type *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_218);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_218.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    std::make_shared<slang::ast::builtins::ArrayMapMethod>();
    local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (Symbol *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_228);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_228.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    lVar3 = (long)local_280 + 4;
  }
  local_298 = (Type *)0x100000000e;
  a_Stack_290[0]._M_pi._0_4_ = 0x11;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    SVar1 = *(SymbolKind *)((long)&a_Stack_290[-1]._M_pi + lVar3);
    local_2b8 = (Type *)CONCAT44(local_2b8._4_4_,0xed);
    std::
    make_shared<slang::ast::builtins::ArraySizeMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
              ((Builtins *)local_2d8,(KnownSystemName *)this);
    local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (Symbol *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_238.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  }
  local_2b8 = (Type *)0xe0000000d;
  a_Stack_2b0[0]._M_pi._0_4_ = 0x11;
  local_280 = &this->voidType;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    SVar1 = *(SymbolKind *)((long)&a_Stack_2b0[-1]._M_pi + lVar3);
    local_298._0_4_ = 0xfd;
    ___a2 = ___a2 & 0xffffff00;
    std::make_shared<slang::ast::builtins::ArraySortMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_298);
    local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (Symbol *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_248);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_248.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    local_298 = (Type *)CONCAT44(local_298._4_4_,0xfe);
    ___a2 = CONCAT31(uStack_2db,1);
    std::make_shared<slang::ast::builtins::ArraySortMethod,slang::parsing::KnownSystemName,bool>
              ((KnownSystemName *)local_2d8,(bool *)&local_298);
    local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ = (SourceLocation)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_258);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_258.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    std::make_shared<slang::ast::builtins::ArrayReverseMethod>();
    local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._0_8_;
    local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
    local_2d8._0_8_ =
         (allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>
          *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_268);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_268.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
    ___a2 = 0xff;
    local_2d8._28_4_ = 0;
    local_2d8._0_8_ = (Symbol *)0x0;
    local_2d8._8_8_ = (pointer)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    local_299 = 1;
    std::
    make_shared<slang::ast::NonConstantFunction,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
              ((KnownSystemName *)&local_298,(VoidType *)&__a2,(int *)local_280,
               (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
               (local_2d8 + 0x1c),(bool *)local_2d8);
    local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_298;
    local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_290[0]._M_pi;
    local_298 = (Type *)0x0;
    a_Stack_290[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_278);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_278.
                super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_290);
    std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
    ~_Vector_base((_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                   *)local_2d8);
  }
  local_298._0_4_ = 0x100;
  std::
  make_shared<slang::ast::builtins::ArraySizeMethod,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)local_2d8,(KnownSystemName *)this);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (SourceLocation)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::DynArrayDeleteMethod,slang::ast::builtins::Builtins&>
            ((Builtins *)local_2d8);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,DynamicArrayType,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::AssocArrayDeleteMethod>();
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::QueueDeleteMethod>();
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (Type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::AssocArrayExistsMethod>();
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x101;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_2d8);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x102;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_2d8);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (SourceLocation)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x103;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_2d8);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x104;
  std::make_shared<slang::ast::builtins::AssocArrayTraversalMethod,slang::parsing::KnownSystemName>
            ((KnownSystemName *)local_2d8);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x105;
  local_2b8._0_1_ = 1;
  std::make_shared<slang::ast::builtins::QueuePopMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_2d8,(bool *)&local_298);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x106;
  local_2b8._0_1_ = 0;
  std::make_shared<slang::ast::builtins::QueuePopMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_2d8,(bool *)&local_298);
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (Symbol *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298._0_4_ = 0x107;
  local_2b8._0_1_ = 1;
  std::make_shared<slang::ast::builtins::QueuePushMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_2d8,(bool *)&local_298);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (SourceLocation)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  local_298 = (Type *)CONCAT44(local_298._4_4_,0x108);
  local_2b8 = (Type *)((ulong)local_2b8._1_7_ << 8);
  std::make_shared<slang::ast::builtins::QueuePushMethod,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)local_2d8,(bool *)&local_298);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::QueueInsertMethod>();
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ = (element_type *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  std::make_shared<slang::ast::builtins::IteratorIndexMethod>();
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2d8._0_8_;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_;
  local_2d8._0_8_ =
       (allocator<std::_Sp_counted_ptr_inplace<slang::ast::builtins::ArrayReductionMethod,_std::allocator<slang::ast::builtins::ArrayReductionMethod>,_(__gnu_cxx::_Lock_policy)2>_>
        *)0x0;
  local_2d8._8_8_ = (pointer)0x0;
  addSystemMethod(this,Iterator,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8 + 8));
  return;
}

Assistant:

void Builtins::registerArrayMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_shared<name##Method>(__VA_ARGS__))

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArrayReduction, KnownSystemName::Or, [](auto& l, auto& r) { l |= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::And, [](auto& l, auto& r) { l &= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::XOr, [](auto& l, auto& r) { l ^= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Sum, [](auto& l, auto& r) { l += r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Product, [](auto& l, auto& r) { l *= r; });

        REGISTER(kind, ArrayLocator, KnownSystemName::Find, ArrayLocatorMethod::All, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindIndex, ArrayLocatorMethod::All, true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirst, ArrayLocatorMethod::First, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirstIndex, ArrayLocatorMethod::First,
                 true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLast, ArrayLocatorMethod::Last, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLastIndex, ArrayLocatorMethod::Last,
                 true);

        REGISTER(kind, ArrayMinMax, KnownSystemName::Min, true);
        REGISTER(kind, ArrayMinMax, KnownSystemName::Max, false);

        REGISTER(kind, ArrayUnique, KnownSystemName::Unique, false);
        REGISTER(kind, ArrayUnique, KnownSystemName::UniqueIndex, true);

        REGISTER(kind, ArrayMap, );
    }

    for (auto kind :
         {SymbolKind::DynamicArrayType, SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArraySize, *this, KnownSystemName::ArraySize);
    }

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::QueueType}) {
        REGISTER(kind, ArraySort, KnownSystemName::Sort, false);
        REGISTER(kind, ArraySort, KnownSystemName::Rsort, true);
        REGISTER(kind, ArrayReverse, );

        addSystemMethod(kind,
                        std::make_shared<NonConstantFunction>(KnownSystemName::Shuffle, voidType, 0,
                                                              std::vector<const Type*>{}, true));
    }

    // Associative arrays also alias "size" to "num" for some reason.
    REGISTER(SymbolKind::AssociativeArrayType, ArraySize, *this, KnownSystemName::Num);

    // "delete" methods
    REGISTER(SymbolKind::DynamicArrayType, DynArrayDelete, *this);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayDelete, );
    REGISTER(SymbolKind::QueueType, QueueDelete, );

    // Associative array methods.
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayExists, );
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::First);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Last);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Next);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Prev);

    // Queue methods
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopFront, true);
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopBack, false);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushFront, true);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushBack, false);
    REGISTER(SymbolKind::QueueType, QueueInsert, );

    // Iterator methods
    REGISTER(SymbolKind::Iterator, IteratorIndex, );
}